

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

ResolvedTrace * __thiscall
backward::TraceResolverImplBase::resolve(TraceResolverImplBase *this,ResolvedTrace *t)

{
  ResolvedTrace *in_RDX;
  ResolvedTrace *in_RDI;
  
  ResolvedTrace::ResolvedTrace(in_RDI,in_RDX);
  return in_RDI;
}

Assistant:

virtual ResolvedTrace resolve(ResolvedTrace t) { return t; }